

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

int Gia_Iso2ManUniqify(Gia_Iso2Man_t *p)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  int iVar4;
  int i_00;
  int *piVar5;
  Gia_Obj_t *pObj_00;
  bool bVar6;
  Gia_Obj_t *local_68;
  uint local_38;
  int nSize;
  int k;
  int i;
  int *pTable;
  Gia_Obj_t *pTemp;
  Gia_Obj_t *pObj;
  int fVerify;
  Gia_Iso2Man_t *p_local;
  
  piVar5 = Vec_IntArray(p->vTable);
  uVar3 = Vec_IntSize(p->vTable);
  Vec_IntClear(p->vPlaces);
  nSize = 0;
  do {
    iVar4 = Vec_IntSize(p->vTied);
    bVar6 = false;
    if (nSize < iVar4) {
      pGVar1 = p->pGia;
      iVar4 = Vec_IntEntry(p->vTied,nSize);
      pTemp = Gia_ManObj(pGVar1,iVar4);
      bVar6 = pTemp != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) {
      for (nSize = 0; iVar4 = Vec_IntSize(p->vPlaces), nSize < iVar4; nSize = nSize + 1) {
        iVar4 = Vec_IntEntry(p->vPlaces,nSize);
        piVar5[iVar4] = 0;
      }
      local_38 = 0;
      Vec_PtrClear(p->vSingles);
      nSize = 0;
      while( true ) {
        iVar4 = Vec_IntSize(p->vTied);
        bVar6 = false;
        if (nSize < iVar4) {
          pGVar1 = p->pGia;
          iVar4 = Vec_IntEntry(p->vTied,nSize);
          pTemp = Gia_ManObj(pGVar1,iVar4);
          bVar6 = pTemp != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        if ((*(ulong *)pTemp >> 0x1e & 1) == 0) {
          Vec_PtrPush(p->vSingles,pTemp);
        }
        else {
          *(ulong *)pTemp = *(ulong *)pTemp & 0xffffffffbfffffff;
          pVVar2 = p->vTied;
          iVar4 = Gia_ObjId(p->pGia,pTemp);
          Vec_IntWriteEntry(pVVar2,local_38,iVar4);
          local_38 = local_38 + 1;
        }
        nSize = nSize + 1;
      }
      Vec_IntShrink(p->vTied,local_38);
      Vec_PtrSort(p->vSingles,Gia_ObjCompareByValue2);
      nSize = 0;
      while( true ) {
        iVar4 = Vec_PtrSize(p->vSingles);
        if (iVar4 <= nSize) {
          iVar4 = Vec_PtrSize(p->vSingles);
          return iVar4;
        }
        pObj_00 = (Gia_Obj_t *)Vec_PtrEntry(p->vSingles,nSize);
        pObj_00->Value = s_256Primes[(int)(p->nUniques & 0xff)] + pObj_00->Value;
        pVVar2 = p->vUniques;
        iVar4 = Gia_ObjId(p->pGia,pObj_00);
        iVar4 = Vec_IntEntry(pVVar2,iVar4);
        if (iVar4 != -1) break;
        pVVar2 = p->vUniques;
        i_00 = Gia_ObjId(p->pGia,pObj_00);
        iVar4 = p->nUniques;
        p->nUniques = iVar4 + 1;
        Vec_IntWriteEntry(pVVar2,i_00,iVar4);
        nSize = nSize + 1;
      }
      __assert_fail("Vec_IntEntry(p->vUniques, Gia_ObjId(p->pGia, pObj)) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                    ,0x150,"int Gia_Iso2ManUniqify(Gia_Iso2Man_t *)");
    }
    local_38 = pTemp->Value % uVar3;
    while( true ) {
      if (piVar5[(int)local_38] == 0) {
        local_68 = (Gia_Obj_t *)0x0;
      }
      else {
        local_68 = Gia_ManObj(p->pGia,piVar5[(int)local_38]);
      }
      if (local_68 == (Gia_Obj_t *)0x0) goto LAB_0096cabb;
      if (local_68->Value == pTemp->Value) break;
      local_38 = (int)(local_38 + 1) % (int)uVar3;
    }
    *(ulong *)local_68 = *(ulong *)local_68 & 0xffffffffbfffffff | 0x40000000;
    *(ulong *)pTemp = *(ulong *)pTemp & 0xffffffffbfffffff | 0x40000000;
LAB_0096cabb:
    if (local_68 == (Gia_Obj_t *)0x0) {
      iVar4 = Gia_ObjId(p->pGia,pTemp);
      piVar5[(int)local_38] = iVar4;
      Vec_IntPush(p->vPlaces,local_38);
    }
    nSize = nSize + 1;
  } while( true );
}

Assistant:

int Gia_Iso2ManUniqify( Gia_Iso2Man_t * p )
{
    int fVerify = 0;
    Gia_Obj_t * pObj, * pTemp;
    int * pTable = Vec_IntArray(p->vTable);
    int i, k, nSize = Vec_IntSize(p->vTable);

    if ( fVerify )
        for ( k = 0; k < nSize; k++ )
            assert( pTable[k] == 0 );
    if ( fVerify )
        Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
            assert( pObj->fMark0 == 0 );

#if 0
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
    {
        printf( "%3d : ", Gia_ObjId(p->pGia, pObj) );
        Extra_PrintBinary( stdout, &pObj->Value, 32 );
        printf( "\n" );
    }
#endif

    // add objects to the table
    Vec_IntClear( p->vPlaces );
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
    {
        for ( k = pObj->Value % nSize; (pTemp = pTable[k] ? Gia_ManObj(p->pGia, pTable[k]) : NULL); k = (k + 1) % nSize )
            if ( pTemp->Value == pObj->Value )
            {
                pTemp->fMark0 = 1;
                pObj->fMark0 = 1;
                break;
            }
        if ( pTemp != NULL )
            continue;
        pTable[k] = Gia_ObjId(p->pGia, pObj);
        Vec_IntPush( p->vPlaces, k );
    }
    // clean the table
    Vec_IntForEachEntry( p->vPlaces, k, i )
        pTable[k] = 0;
    // collect singleton objects and compact tied objects
    k = 0;
    Vec_PtrClear( p->vSingles );
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
        if ( pObj->fMark0 == 0 )
            Vec_PtrPush( p->vSingles, pObj );
        else 
        {
            pObj->fMark0 = 0;
            Vec_IntWriteEntry( p->vTied, k++, Gia_ObjId(p->pGia, pObj) );
        }
    Vec_IntShrink( p->vTied, k );
    // sort singletons
    Vec_PtrSort( p->vSingles, (int (*)(void))Gia_ObjCompareByValue2 );
    // add them to unique and increment signature
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vSingles, pObj, i )
    {
        pObj->Value += s_256Primes[p->nUniques & ISO_MASK];
        assert( Vec_IntEntry(p->vUniques, Gia_ObjId(p->pGia, pObj)) == -1 );
        Vec_IntWriteEntry( p->vUniques, Gia_ObjId(p->pGia, pObj), p->nUniques++ );
    }
    return Vec_PtrSize( p->vSingles );
}